

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O3

ssize_t __thiscall
wasm::LEB<long,_signed_char>::read
          (LEB<long,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  string *psVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  ulong uVar8;
  
  uVar7 = CONCAT44(in_register_00000034,__fd);
  this->value = 0;
  bVar3 = 0;
  uVar8 = uVar7;
  uVar10 = 0;
  while( true ) {
    if (*(long *)(uVar7 + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (**(code **)(uVar7 + 0x18))(uVar7,uVar8,__buf,__nbytes);
    uVar4 = -(uint)(uVar10 == 0) | ~(uint)(-1L << (bVar3 & 0x3f));
    __nbytes = uVar10 & 0xffffffff;
    uVar6 = ~uVar4 & 0x7f;
    uVar8 = (ulong)uVar6;
    uVar9 = (bVar1 & 0x7f) & uVar6;
    __buf = (void *)((ulong)(uVar4 & (bVar1 & 0x7f)) << ((byte)__nbytes & 0x3f) | this->value);
    this->value = (long)__buf;
    if ((long)__buf < 0) {
      if (uVar9 != uVar6) {
        psVar2 = (string *)__cxa_allocate_exception(0x30);
        local_a8 = local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a8,"Unused negative LEB bits must be 1s","");
        *(string **)psVar2 = psVar2 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar2,local_a8,local_a8 + local_a0);
        *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
        *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
        __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (uVar9 != 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Unused non-negative LEB bits must be 0s","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_88,local_88 + local_80);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (-1 < (char)bVar1) break;
    bVar3 = bVar3 - 7;
    bVar11 = 0x38 < uVar10;
    uVar10 = uVar10 + 7;
    if (bVar11) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"LEB overflow","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_68,local_68 + local_60);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  if (uVar10 < 0x39 && 0x3f < bVar1) {
    bVar3 = 0x39 - (char)uVar10;
    lVar5 = ((long)__buf << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
    this->value = lVar5;
    if (-1 < lVar5) {
      psVar2 = (string *)__cxa_allocate_exception(0x30);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48," LEBsign-extend should produce a negative value","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_48,local_48 + local_40);
      *(undefined4 *)(psVar2 + 0x20) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x24) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x28) = 0xffffffff;
      *(undefined4 *)(psVar2 + 0x2c) = 0xffffffff;
      __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }